

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_st_d_mipsel(CPUMIPSState_conflict2 *env,uint32_t wd,target_ulong_conflict addr)

{
  int mmu_idx_00;
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  int mmu_idx;
  wr_t *pwd;
  target_ulong_conflict addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict2 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  mmu_idx_00 = cpu_mmu_index(env,false);
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_64,idx);
  ensure_writable_pages(env,addr,mmu_idx_00,unaff_retaddr);
  helper_le_stq_mmu_mipsel((CPUArchState_conflict8 *)env,addr,pfVar1->d,oi_00,unaff_retaddr);
  helper_le_stq_mmu_mipsel
            ((CPUArchState_conflict8 *)env,addr + 8,(&pfVar1->d)[1],oi_00,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_d(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_DOUBLE)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
    helper_ret_stq_mmu(env, addr + (0 << DF_DOUBLE), pwd->d[0], oi, GETPC());
    helper_ret_stq_mmu(env, addr + (1 << DF_DOUBLE), pwd->d[1], oi, GETPC());
}